

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_bc7enc.cpp
# Opt level: O0

uint64_t basisu::color_cell_compression
                   (uint32_t mode,color_cell_compressor_params *pParams,
                   color_cell_compressor_results *pResults,
                   bc7enc_compress_block_params *pComp_params)

{
  bc7enc_vec4F xh_00;
  bc7enc_vec4F xh_01;
  bc7enc_vec4F xh_02;
  bc7enc_vec4F xh_03;
  bc7enc_vec4F xh_04;
  bc7enc_vec4F xl_00;
  bc7enc_vec4F xl_01;
  bc7enc_vec4F xl_02;
  bc7enc_vec4F xl_03;
  bc7enc_vec4F xl_04;
  bc7enc_vec4F xl_05;
  bool bVar1;
  uint64_t uVar2;
  uint8_t *in_RCX;
  ulong *in_RDX;
  color_cell_compressor_params *in_RSI;
  int in_EDI;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bc7enc_vec4F bVar10;
  uint64_t avg_err_5;
  uint32_t b_8;
  uint32_t g_7;
  uint32_t r_7;
  color_cell_compressor_results avg_results_5;
  uint64_t avg_err_4;
  uint32_t b_7;
  uint32_t g_6;
  uint32_t r_6;
  color_cell_compressor_results avg_results_4;
  uint64_t avg_err_3;
  uint32_t a_1;
  uint32_t b_6;
  uint32_t g_5;
  uint32_t r_5;
  color_cell_compressor_results avg_results_3;
  uint64_t avg_err_2;
  uint32_t b_5;
  uint32_t g_4;
  uint32_t r_4;
  color_cell_compressor_results avg_results_2;
  uint64_t avg_err_1;
  uint32_t b_4;
  uint32_t g_3;
  uint32_t r_3;
  color_cell_compressor_results avg_results_1;
  uint64_t avg_err;
  uint32_t b_3;
  uint32_t g_2;
  uint32_t r_2;
  color_cell_compressor_results avg_results;
  uint32_t i_9;
  int hy;
  int ly;
  int Q;
  uint32_t uber_err_thresh;
  uint32_t sel_3;
  uint32_t i_8;
  uint32_t sel_2;
  uint32_t i_7;
  bc7enc_vec4F xh_1;
  bc7enc_vec4F xl_1;
  uint32_t sel_1;
  uint32_t i_6;
  uint32_t sel;
  uint32_t i_5;
  uint32_t max_sel;
  uint32_t min_sel;
  int max_selector;
  uint8_t selectors_temp1 [16];
  uint8_t selectors_temp [16];
  bc7enc_vec4F xh;
  bc7enc_vec4F xl;
  uint32_t i_4;
  bc7enc_vec4F whiteVec;
  bc7enc_vec4F c1;
  bc7enc_vec4F c0;
  bc7enc_vec4F b1;
  bc7enc_vec4F b0;
  float d_1;
  bc7enc_vec4F q;
  bc7enc_vec4F color_2;
  uint32_t i_3;
  float h;
  float l;
  bc7enc_vec4F maxColor;
  bc7enc_vec4F minColor;
  float len;
  float m;
  float b_2;
  float g_1;
  float r_1;
  uint32_t iter;
  float xb;
  float xg;
  float xr;
  float b_1;
  float g;
  float r;
  color_quad_u8 *pV;
  uint32_t i_2;
  float cov [6];
  bc7enc_vec4F n;
  bc7enc_vec4F d;
  bc7enc_vec4F c;
  bc7enc_vec4F b;
  bc7enc_vec4F a;
  bc7enc_vec4F color_1;
  uint32_t i_1;
  bc7enc_vec4F meanColorScaled;
  bc7enc_vec4F color;
  uint32_t i;
  bc7enc_vec4F axis;
  bc7enc_vec4F meanColor;
  uint32_t ca;
  uint32_t cb;
  uint32_t cg;
  uint32_t cr;
  bc7enc_vec4F *in_stack_fffffffffffff978;
  bc7enc_vec4F *in_stack_fffffffffffff980;
  int local_674;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  uint32_t in_stack_fffffffffffff9b8;
  float in_stack_fffffffffffff9bc;
  uint32_t in_stack_fffffffffffff9c0;
  float in_stack_fffffffffffff9c4;
  color_cell_compressor_results *in_stack_fffffffffffff9c8;
  color_cell_compressor_params *in_stack_fffffffffffff9d0;
  color_cell_compressor_results *in_stack_fffffffffffff9d8;
  color_cell_compressor_results *pResults_00;
  undefined4 in_stack_fffffffffffff9e0;
  undefined4 uVar11;
  undefined2 in_stack_fffffffffffff9e4;
  undefined1 uVar12;
  byte in_stack_fffffffffffff9e7;
  undefined1 local_600 [40];
  color_quad_u8 *in_stack_fffffffffffffa28;
  color_cell_compressor_results *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  undefined4 in_stack_fffffffffffffa40;
  uint32_t in_stack_fffffffffffffa44;
  bc7enc_vec4F *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  float in_stack_fffffffffffffa54;
  uint8_t *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  float in_stack_fffffffffffffa64;
  undefined1 local_570 [48];
  ulong local_540;
  int local_534;
  int local_530;
  int local_52c;
  undefined1 local_528 [48];
  ulong local_4f8;
  int local_4ec;
  int local_4e8;
  int local_4e4;
  undefined1 local_4e0 [48];
  ulong local_4b0;
  int local_4a4;
  int local_4a0;
  int local_49c;
  undefined1 local_498 [48];
  float local_468 [2];
  float afStack_460 [2];
  float local_458 [2];
  float afStack_450 [5];
  float local_43c [4];
  float local_42c [2];
  float afStack_424 [2];
  uint local_41c;
  int local_418;
  int local_414;
  int local_410;
  uint local_40c;
  float local_408 [2];
  float afStack_400 [2];
  float local_3f8 [2];
  float afStack_3f0 [4];
  float local_3e0 [4];
  float local_3d0 [2];
  float afStack_3c8 [2];
  uint local_3c0;
  uint local_3bc;
  float local_3b8 [2];
  float afStack_3b0 [2];
  float local_3a8 [2];
  float afStack_3a0 [4];
  float local_390 [4];
  float local_380 [2];
  float afStack_378 [2];
  uint local_370;
  uint local_36c;
  float local_368 [2];
  float afStack_360 [2];
  float local_358 [2];
  float afStack_350 [2];
  float local_348 [4];
  float local_338 [2];
  float afStack_330 [2];
  bc7enc_vec4F local_328;
  bc7enc_vec4F local_318;
  uint local_304;
  uint local_300;
  uint32_t local_2fc;
  uint local_2f8;
  uint32_t local_2f4;
  uint32_t local_2f0;
  int local_2ec;
  undefined1 local_2e8 [16];
  byte local_2d8 [16];
  float local_2c8 [2];
  float afStack_2c0 [2];
  float local_2b8 [2];
  float afStack_2b0 [2];
  float local_2a8 [4];
  float local_298 [2];
  float afStack_290 [2];
  bc7enc_vec4F local_288;
  bc7enc_vec4F local_278;
  uint local_25c;
  float local_258 [2];
  float afStack_250 [2];
  float local_248 [2];
  float afStack_240 [2];
  bc7enc_vec4F local_238;
  float local_228 [4];
  float local_218 [4];
  float local_208 [4];
  float local_1f8 [4];
  float local_1e8 [4];
  float local_1d8 [4];
  float local_1c8;
  bc7enc_vec4F local_1c4;
  float local_1b4 [4];
  uint local_1a4;
  float local_1a0;
  float local_19c;
  bc7enc_vec4F local_198;
  bc7enc_vec4F local_188;
  float local_178;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  uint local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  color_quad_u8 *local_148;
  uint local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_128;
  float local_124;
  bc7enc_vec4F local_118;
  bc7enc_vec4F local_108;
  bc7enc_vec4F local_f8;
  bc7enc_vec4F local_e8;
  bc7enc_vec4F local_d8;
  float local_c8 [4];
  undefined1 local_b8 [36];
  uint8_t *local_94;
  color_quad_u8 local_8c;
  float fStack_88;
  float local_84;
  undefined1 local_7c [16];
  float local_6c [4];
  uint local_5c;
  undefined1 local_58 [8];
  color_quad_u8 local_50;
  color_quad_u8 cStack_4c;
  undefined1 local_48 [8];
  uint8_t *local_40;
  uint32_t local_38;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  uint8_t *local_28;
  ulong *local_20;
  color_cell_compressor_params *local_18;
  int local_c;
  
  if (in_RSI->m_astc_endpoint_range == 0) {
    in_stack_fffffffffffff9e7 = 1;
    if (in_EDI != 6) {
      in_stack_fffffffffffff9e7 = in_RSI->m_has_alpha != '\0' ^ 0xff;
    }
    if ((in_stack_fffffffffffff9e7 & 1) == 0) {
      __assert_fail("(mode == 6) || (!pParams->m_has_alpha)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                    ,0x55e,
                    "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                   );
    }
  }
  uVar12 = false;
  if (in_RSI->m_num_selector_weights != 0) {
    uVar12 = in_RSI->m_num_selector_weights < 0x21;
  }
  if ((bool)uVar12 == false) {
    __assert_fail("pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x560,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (*in_RSI->m_pSelector_weights != 0) {
    __assert_fail("pParams->m_pSelector_weights[0] == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x561,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  if (in_RSI->m_pSelector_weights[in_RSI->m_num_selector_weights - 1] != 0x40) {
    __assert_fail("pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_bc7enc.cpp"
                  ,0x562,
                  "uint64_t basisu::color_cell_compression(uint32_t, const color_cell_compressor_params *, color_cell_compressor_results *, const bc7enc_compress_block_params *)"
                 );
  }
  *in_RDX = 0xffffffffffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_c = in_EDI;
  if (in_RSI->m_pForce_selectors == (uint8_t *)0x0) {
    if (in_EDI == 1) {
      bVar1 = is_solid_rgb(in_RSI,&local_2c,&local_30,&local_34);
      if (bVar1) {
        uVar2 = pack_mode1_to_one_color
                          ((color_cell_compressor_params *)
                           CONCAT17(in_stack_fffffffffffff9e7,
                                    CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9e4,
                                                             in_stack_fffffffffffff9e0))),
                           in_stack_fffffffffffff9d8,
                           (uint32_t)((ulong)in_stack_fffffffffffff9d0 >> 0x20),
                           (uint32_t)in_stack_fffffffffffff9d0,
                           (uint32_t)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                           (uint8_t *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0))
        ;
        return uVar2;
      }
    }
    else if (((in_RSI->m_astc_endpoint_range == 8) && (in_RSI->m_num_selector_weights == 8)) &&
            (in_RSI->m_has_alpha == '\0')) {
      bVar1 = is_solid_rgb(in_RSI,&local_2c,&local_30,&local_34);
      if (bVar1) {
        uVar2 = pack_astc_4bit_3bit_to_one_color
                          (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                           (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                           (uint32_t)in_stack_fffffffffffff9bc,
                           (uint8_t *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0))
        ;
        return uVar2;
      }
    }
    else if (((in_RSI->m_astc_endpoint_range == 7) && (in_RSI->m_num_selector_weights == 4)) &&
            (in_RSI->m_has_alpha == '\0')) {
      bVar1 = is_solid_rgb(in_RSI,&local_2c,&local_30,&local_34);
      if (bVar1) {
        uVar2 = pack_astc_range7_2bit_to_one_color
                          (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                           (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                           (uint32_t)in_stack_fffffffffffff9bc,
                           (uint8_t *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0))
        ;
        return uVar2;
      }
    }
    else if (((in_RSI->m_astc_endpoint_range == 8) && (in_RSI->m_num_selector_weights == 4)) &&
            (in_RSI->m_has_alpha != '\0')) {
      bVar1 = is_solid_rgba(in_RSI,&local_2c,&local_30,&local_34,&local_38);
      if (bVar1) {
        uVar2 = pack_astc_4bit_2bit_to_one_color_rgba
                          (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                           (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                           (uint32_t)in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                           (uint8_t *)
                           CONCAT17(in_stack_fffffffffffff9e7,
                                    CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9e4,
                                                             in_stack_fffffffffffff9e0))));
        return uVar2;
      }
    }
    else if (((in_RSI->m_astc_endpoint_range == 0xd) && (in_RSI->m_num_selector_weights == 4)) &&
            (in_RSI->m_has_alpha == '\0')) {
      bVar1 = is_solid_rgb(in_RSI,&local_2c,&local_30,&local_34);
      if (bVar1) {
        uVar2 = pack_astc_range13_2bit_to_one_color
                          (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                           (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                           (uint32_t)in_stack_fffffffffffff9bc,
                           (uint8_t *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0))
        ;
        return uVar2;
      }
    }
    else if (((in_RSI->m_astc_endpoint_range == 0xb) && (in_RSI->m_num_selector_weights == 0x20)) &&
            ((in_RSI->m_has_alpha == '\0' &&
             (bVar1 = is_solid_rgb(in_RSI,&local_2c,&local_30,&local_34), bVar1)))) {
      uVar2 = pack_astc_range11_5bit_to_one_color
                        (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                         (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                         (uint32_t)in_stack_fffffffffffff9bc,
                         (uint8_t *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
      return uVar2;
    }
  }
  vec4F_set_scalar((bc7enc_vec4F *)local_48,0.0);
  for (local_5c = 0; local_5c < local_18->m_num_pixels; local_5c = local_5c + 1) {
    local_6c = (float  [4])vec4F_from_color((color_quad_u8 *)0x4a4016);
    bVar10 = vec4F_add(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_7c._0_8_ = bVar10.m_c._0_8_;
    local_48._0_4_ = local_7c._0_4_;
    local_48._4_4_ = local_7c._4_4_;
    local_7c._8_8_ = bVar10.m_c._8_8_;
    local_40 = (uint8_t *)local_7c._8_8_;
    local_7c = (undefined1  [16])bVar10;
  }
  uVar11 = 0x3f800000;
  pResults_00 = (color_cell_compressor_results *)local_48;
  bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
  _local_84 = bVar10.m_c._8_8_;
  _local_8c = bVar10.m_c._0_8_;
  join_0x00001240_0x00001200_ =
       vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
  local_48 = (undefined1  [8])local_b8._28_8_;
  local_40 = local_94;
  vec4F_saturate_in_place((bc7enc_vec4F *)0x4a413b);
  if (local_18->m_has_alpha == '\0') {
    memset(&local_138,0,0x18);
    for (local_13c = 0; local_13c < local_18->m_num_pixels; local_13c = local_13c + 1) {
      local_148 = local_18->m_pPixels + local_13c;
      local_14c = (float)local_148->m_c[0] - (float)local_8c.m_c;
      local_150 = (float)local_148->m_c[1] - fStack_88;
      local_154 = (float)local_148->m_c[2] - local_84;
      local_138 = local_14c * local_14c + local_138;
      local_134 = local_14c * local_150 + local_134;
      local_130 = local_14c * local_154 + local_130;
      local_12c = local_150 * local_150 + local_12c;
      local_128 = local_150 * local_154 + local_128;
      local_124 = local_154 * local_154 + local_124;
    }
    local_158 = 0.9;
    local_15c = 1.0;
    local_160 = 0.7;
    for (local_164 = 0; local_164 < 3; local_164 = local_164 + 1) {
      local_168 = local_158 * local_138 + local_15c * local_134 + local_160 * local_130;
      local_16c = local_158 * local_134 + local_15c * local_12c + local_160 * local_128;
      local_170 = local_158 * local_130 + local_15c * local_128 + local_160 * local_124;
      fVar3 = maximumf(ABS(local_168),ABS(local_16c));
      local_174 = maximumf(fVar3,ABS(local_170));
      if (1e-10 < local_174) {
        local_174 = 1.0 / local_174;
        local_168 = local_174 * local_168;
        local_16c = local_174 * local_16c;
        local_170 = local_174 * local_170;
      }
      local_158 = local_168;
      local_15c = local_16c;
      local_160 = local_170;
    }
    local_178 = local_158 * local_158 + local_15c * local_15c + local_160 * local_160;
    if (1e-10 <= local_178) {
      local_178 = sqrtf(local_178);
      local_178 = 1.0 / local_178;
      local_158 = local_178 * local_158;
      local_15c = local_178 * local_15c;
      local_160 = local_178 * local_160;
      vec4F_set((bc7enc_vec4F *)local_58,local_158,local_15c,local_160,0.0);
    }
    else {
      vec4F_set_scalar((bc7enc_vec4F *)local_58,0.0);
    }
  }
  else {
    vec4F_set_scalar((bc7enc_vec4F *)local_58,0.0);
    for (local_b8._24_4_ = 0; (uint)local_b8._24_4_ < local_18->m_num_pixels;
        local_b8._24_4_ = local_b8._24_4_ + 1) {
      local_b8._0_16_ = (undefined1  [16])vec4F_from_color((color_quad_u8 *)0x4a419b);
      in_stack_fffffffffffff9d0 = (color_cell_compressor_params *)local_b8;
      local_c8 = (float  [4])vec4F_sub(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      local_b8._0_16_ = (undefined1  [16])local_c8;
      local_d8 = vec4F_mul(in_stack_fffffffffffff980,
                           (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
      local_e8 = vec4F_mul(in_stack_fffffffffffff980,
                           (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
      local_f8 = vec4F_mul(in_stack_fffffffffffff980,
                           (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
      local_108 = vec4F_mul(in_stack_fffffffffffff980,
                            (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
      if (local_b8._24_4_ == 0) {
        in_stack_fffffffffffff9c8 = (color_cell_compressor_results *)local_b8;
      }
      else {
        in_stack_fffffffffffff9c8 = (color_cell_compressor_results *)local_58;
      }
      local_118.m_c._0_8_ = in_stack_fffffffffffff9c8->m_best_overall_err;
      local_118.m_c[2] = *(float *)&in_stack_fffffffffffff9c8->m_low_endpoint;
      local_118.m_c[3] = *(float *)&in_stack_fffffffffffff9c8->m_high_endpoint;
      vec4F_normalize_in_place(in_stack_fffffffffffff980);
      fVar3 = vec4F_dot(&local_d8,&local_118);
      local_58._0_4_ = fVar3 + (float)local_58._0_4_;
      fVar3 = vec4F_dot(&local_e8,&local_118);
      local_58._4_4_ = fVar3 + (float)local_58._4_4_;
      fVar3 = vec4F_dot(&local_f8,&local_118);
      local_50.m_c = (uint8_t  [4])(fVar3 + local_50.m_c);
      fVar3 = vec4F_dot(&local_108,&local_118);
      cStack_4c.m_c = (uint8_t  [4])(fVar3 + cStack_4c.m_c);
    }
    vec4F_normalize_in_place(in_stack_fffffffffffff980);
  }
  fVar3 = vec4F_dot((bc7enc_vec4F *)local_58,(bc7enc_vec4F *)local_58);
  if (fVar3 < 0.5) {
    if (local_18->m_perceptual == '\0') {
      in_stack_fffffffffffff9b8 = 0;
      in_stack_fffffffffffff9bc = 1.0;
      if (local_18->m_has_alpha == '\0') {
        in_stack_fffffffffffff9bc = 0.0;
      }
      vec4F_set((bc7enc_vec4F *)local_58,1.0,1.0,1.0,in_stack_fffffffffffff9bc);
    }
    else {
      in_stack_fffffffffffff9c0 = 0;
      in_stack_fffffffffffff9c4 = 0.715;
      if (local_18->m_has_alpha == '\0') {
        in_stack_fffffffffffff9c4 = 0.0;
      }
      vec4F_set((bc7enc_vec4F *)local_58,0.213,0.715,0.072,in_stack_fffffffffffff9c4);
    }
    vec4F_normalize_in_place(in_stack_fffffffffffff980);
  }
  local_19c = 1e+09;
  local_1a0 = -1e+09;
  for (local_1a4 = 0; local_1a4 < local_18->m_num_pixels; local_1a4 = local_1a4 + 1) {
    local_1b4 = (float  [4])vec4F_from_color((color_quad_u8 *)0x4a49dd);
    local_1c4 = vec4F_sub(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_1c8 = vec4F_dot(&local_1c4,(bc7enc_vec4F *)local_58);
    local_19c = minimumf(local_19c,local_1c8);
    local_1a0 = maximumf(local_1a0,local_1c8);
  }
  local_19c = local_19c * 0.003921569;
  local_1a0 = local_1a0 * 0.003921569;
  local_1d8 = (float  [4])
              vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20))
  ;
  local_1e8 = (float  [4])
              vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20))
  ;
  local_1f8 = (float  [4])vec4F_add(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  local_208 = (float  [4])vec4F_add(in_stack_fffffffffffff980,in_stack_fffffffffffff978);
  bVar10 = vec4F_saturate((bc7enc_vec4F *)0x4a4b6d);
  local_218._0_8_ = bVar10.m_c._0_8_;
  local_218._8_8_ = bVar10.m_c._8_8_;
  local_188.m_c[0] = local_218[0];
  local_188.m_c[1] = local_218[1];
  local_188.m_c[2] = local_218[2];
  local_188.m_c[3] = local_218[3];
  local_218 = bVar10.m_c;
  bVar10 = vec4F_saturate((bc7enc_vec4F *)0x4a4b9c);
  local_228._0_8_ = bVar10.m_c._0_8_;
  local_198.m_c[0] = local_228[0];
  local_198.m_c[1] = local_228[1];
  local_228._8_8_ = bVar10.m_c._8_8_;
  local_198.m_c[2] = local_228[2];
  local_198.m_c[3] = local_228[3];
  local_228 = bVar10.m_c;
  vec4F_set_scalar(&local_238,1.0);
  fVar3 = vec4F_dot(&local_188,&local_238);
  fVar4 = vec4F_dot(&local_198,&local_238);
  if (fVar4 < fVar3) {
    std::swap<float>(local_188.m_c,local_198.m_c);
    std::swap<float>(local_188.m_c + 1,local_198.m_c + 1);
    std::swap<float>(local_188.m_c + 2,local_198.m_c + 2);
    std::swap<float>(local_188.m_c + 3,local_198.m_c + 3);
  }
  local_248[0] = local_188.m_c[0];
  local_248[1] = local_188.m_c[1];
  afStack_240[0] = local_188.m_c[2];
  afStack_240[1] = local_188.m_c[3];
  local_258[0] = local_198.m_c[0];
  local_258[1] = local_198.m_c[1];
  afStack_250[0] = local_198.m_c[2];
  afStack_250[1] = local_198.m_c[3];
  xl_00.m_c[2] = (float)in_stack_fffffffffffffa60;
  xl_00.m_c._0_8_ = in_stack_fffffffffffffa58;
  xl_00.m_c[3] = in_stack_fffffffffffffa64;
  bVar10.m_c[2] = (float)in_stack_fffffffffffffa50;
  bVar10.m_c._0_8_ = in_stack_fffffffffffffa48;
  bVar10.m_c[3] = in_stack_fffffffffffffa54;
  uVar2 = find_optimal_solution
                    (in_stack_fffffffffffffa44,xl_00,bVar10,
                     (color_cell_compressor_params *)
                     CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                     in_stack_fffffffffffffa30);
  if (uVar2 == 0) {
    return 0;
  }
  for (local_25c = 0; local_25c < *(uint *)(local_28 + 0x1c); local_25c = local_25c + 1) {
    vec4F_set_scalar(&local_278,0.0);
    vec4F_set_scalar(&local_288,0.0);
    if (local_18->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                ((uint32_t)in_stack_fffffffffffffa54,(uint8_t *)in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                 (bc7enc_vec4F *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    }
    else {
      compute_least_squares_endpoints_rgba
                ((uint32_t)in_stack_fffffffffffffa64,in_stack_fffffffffffffa58,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    }
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    afStack_290 = bVar10.m_c._8_8_;
    local_298 = bVar10.m_c._0_8_;
    local_278.m_c._0_8_ = local_298;
    local_278.m_c._8_8_ = afStack_290;
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    local_2a8._0_8_ = bVar10.m_c._0_8_;
    local_2a8._8_8_ = bVar10.m_c._8_8_;
    local_288.m_c[0] = local_2a8[0];
    local_288.m_c[1] = local_2a8[1];
    local_288.m_c[2] = local_2a8[2];
    local_288.m_c[3] = local_2a8[3];
    local_2b8[0] = local_278.m_c[0];
    local_2b8[1] = local_278.m_c[1];
    afStack_2b0[0] = local_278.m_c[2];
    afStack_2b0[1] = local_278.m_c[3];
    local_2c8[0] = local_2a8[0];
    local_2c8[1] = local_2a8[1];
    afStack_2c0[0] = local_2a8[2];
    afStack_2c0[1] = local_2a8[3];
    xl_01.m_c[2] = (float)in_stack_fffffffffffffa60;
    xl_01.m_c._0_8_ = in_stack_fffffffffffffa58;
    xl_01.m_c[3] = in_stack_fffffffffffffa64;
    xh_00.m_c[2] = (float)in_stack_fffffffffffffa50;
    xh_00.m_c._0_8_ = in_stack_fffffffffffffa48;
    xh_00.m_c[3] = in_stack_fffffffffffffa54;
    local_2a8 = bVar10.m_c;
    uVar2 = find_optimal_solution
                      (in_stack_fffffffffffffa44,xl_01,xh_00,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                       in_stack_fffffffffffffa30);
    if (uVar2 == 0) {
      return 0;
    }
  }
  if ((local_18->m_pForce_selectors == (uint8_t *)0x0) && (*(int *)(local_28 + 0x14) != 0)) {
    memcpy(local_2d8,(void *)local_20[3],(ulong)local_18->m_num_pixels);
    local_2ec = local_18->m_num_selector_weights - 1;
    local_2f0 = 0x100;
    local_2f4 = 0;
    for (local_2f8 = 0; local_2f8 < local_18->m_num_pixels; local_2f8 = local_2f8 + 1) {
      local_2fc = (uint32_t)local_2d8[local_2f8];
      local_2f0 = minimumu(local_2f0,local_2fc);
      local_2f4 = maximumu(local_2f4,local_2fc);
    }
    for (local_300 = 0; local_300 < local_18->m_num_pixels; local_300 = local_300 + 1) {
      local_304 = (uint)local_2d8[local_300];
      if ((local_304 == local_2f0) && (local_304 < local_18->m_num_selector_weights - 1)) {
        local_304 = local_304 + 1;
      }
      local_2e8[local_300] = (char)local_304;
    }
    vec4F_set_scalar(&local_318,0.0);
    vec4F_set_scalar(&local_328,0.0);
    if (local_18->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                ((uint32_t)in_stack_fffffffffffffa54,(uint8_t *)in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                 (bc7enc_vec4F *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    }
    else {
      compute_least_squares_endpoints_rgba
                ((uint32_t)in_stack_fffffffffffffa64,in_stack_fffffffffffffa58,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    }
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    afStack_330 = bVar10.m_c._8_8_;
    local_338 = bVar10.m_c._0_8_;
    local_318.m_c._0_8_ = local_338;
    local_318.m_c._8_8_ = afStack_330;
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    local_348._0_8_ = bVar10.m_c._0_8_;
    local_348._8_8_ = bVar10.m_c._8_8_;
    local_328.m_c[0] = local_348[0];
    local_328.m_c[1] = local_348[1];
    local_328.m_c[2] = local_348[2];
    local_328.m_c[3] = local_348[3];
    local_358[0] = local_318.m_c[0];
    local_358[1] = local_318.m_c[1];
    afStack_350[0] = local_318.m_c[2];
    afStack_350[1] = local_318.m_c[3];
    local_368[0] = local_348[0];
    local_368[1] = local_348[1];
    afStack_360[0] = local_348[2];
    afStack_360[1] = local_348[3];
    xl_02.m_c[2] = (float)in_stack_fffffffffffffa60;
    xl_02.m_c._0_8_ = in_stack_fffffffffffffa58;
    xl_02.m_c[3] = in_stack_fffffffffffffa64;
    xh_01.m_c[2] = (float)in_stack_fffffffffffffa50;
    xh_01.m_c._0_8_ = in_stack_fffffffffffffa48;
    xh_01.m_c[3] = in_stack_fffffffffffffa54;
    local_348 = bVar10.m_c;
    uVar2 = find_optimal_solution
                      (in_stack_fffffffffffffa44,xl_02,xh_01,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                       in_stack_fffffffffffffa30);
    if (uVar2 == 0) {
      return 0;
    }
    for (local_36c = 0; local_36c < local_18->m_num_pixels; local_36c = local_36c + 1) {
      local_370 = (uint)local_2d8[local_36c];
      if ((local_370 == local_2f4) && (local_370 != 0)) {
        local_370 = local_370 - 1;
      }
      local_2e8[local_36c] = (char)local_370;
    }
    if (local_18->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                ((uint32_t)in_stack_fffffffffffffa54,(uint8_t *)in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                 (bc7enc_vec4F *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    }
    else {
      compute_least_squares_endpoints_rgba
                ((uint32_t)in_stack_fffffffffffffa64,in_stack_fffffffffffffa58,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    }
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    afStack_378 = bVar10.m_c._8_8_;
    local_380 = bVar10.m_c._0_8_;
    local_318.m_c._0_8_ = local_380;
    local_318.m_c._8_8_ = afStack_378;
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    local_390._0_8_ = bVar10.m_c._0_8_;
    local_390._8_8_ = bVar10.m_c._8_8_;
    local_328.m_c[0] = local_390[0];
    local_328.m_c[1] = local_390[1];
    local_328.m_c[2] = local_390[2];
    local_328.m_c[3] = local_390[3];
    local_3a8[0] = local_318.m_c[0];
    local_3a8[1] = local_318.m_c[1];
    afStack_3a0[0] = local_318.m_c[2];
    afStack_3a0[1] = local_318.m_c[3];
    local_3b8[0] = local_390[0];
    local_3b8[1] = local_390[1];
    afStack_3b0[0] = local_390[2];
    afStack_3b0[1] = local_390[3];
    xl_03.m_c[2] = (float)in_stack_fffffffffffffa60;
    xl_03.m_c._0_8_ = in_stack_fffffffffffffa58;
    xl_03.m_c[3] = in_stack_fffffffffffffa64;
    xh_02.m_c[2] = (float)in_stack_fffffffffffffa50;
    xh_02.m_c._0_8_ = in_stack_fffffffffffffa48;
    xh_02.m_c[3] = in_stack_fffffffffffffa54;
    local_390 = bVar10.m_c;
    uVar2 = find_optimal_solution
                      (in_stack_fffffffffffffa44,xl_03,xh_02,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                       in_stack_fffffffffffffa30);
    if (uVar2 == 0) {
      return 0;
    }
    for (local_3bc = 0; local_3bc < local_18->m_num_pixels; local_3bc = local_3bc + 1) {
      local_3c0 = (uint)local_2d8[local_3bc];
      if ((local_3c0 == local_2f0) && (local_3c0 < local_18->m_num_selector_weights - 1)) {
        local_3c0 = local_3c0 + 1;
      }
      else if ((local_3c0 == local_2f4) && (local_3c0 != 0)) {
        local_3c0 = local_3c0 - 1;
      }
      local_2e8[local_3bc] = (char)local_3c0;
    }
    if (local_18->m_has_alpha == '\0') {
      compute_least_squares_endpoints_rgb
                ((uint32_t)in_stack_fffffffffffffa54,(uint8_t *)in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                 (bc7enc_vec4F *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
    }
    else {
      compute_least_squares_endpoints_rgba
                ((uint32_t)in_stack_fffffffffffffa64,in_stack_fffffffffffffa58,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 in_stack_fffffffffffffa48,
                 (bc7enc_vec4F *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    }
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    afStack_3c8 = bVar10.m_c._8_8_;
    local_3d0 = bVar10.m_c._0_8_;
    local_318.m_c._0_8_ = local_3d0;
    local_318.m_c._8_8_ = afStack_3c8;
    bVar10 = vec4F_mul(in_stack_fffffffffffff980,(float)((ulong)in_stack_fffffffffffff978 >> 0x20));
    local_3e0._0_8_ = bVar10.m_c._0_8_;
    local_3e0._8_8_ = bVar10.m_c._8_8_;
    local_328.m_c[0] = local_3e0[0];
    local_328.m_c[1] = local_3e0[1];
    local_328.m_c[2] = local_3e0[2];
    local_328.m_c[3] = local_3e0[3];
    local_3f8[0] = local_318.m_c[0];
    local_3f8[1] = local_318.m_c[1];
    afStack_3f0[0] = local_318.m_c[2];
    afStack_3f0[1] = local_318.m_c[3];
    local_408[0] = local_3e0[0];
    local_408[1] = local_3e0[1];
    afStack_400[0] = local_3e0[2];
    afStack_400[1] = local_3e0[3];
    fVar4 = bVar10.m_c[1];
    uVar8 = 0;
    uVar9 = 0;
    xl_04.m_c[2] = (float)in_stack_fffffffffffffa60;
    xl_04.m_c._0_8_ = in_stack_fffffffffffffa58;
    xl_04.m_c[3] = in_stack_fffffffffffffa64;
    xh_03.m_c[2] = (float)in_stack_fffffffffffffa50;
    xh_03.m_c._0_8_ = in_stack_fffffffffffffa48;
    xh_03.m_c[3] = in_stack_fffffffffffffa54;
    local_3e0 = bVar10.m_c;
    uVar2 = find_optimal_solution
                      (in_stack_fffffffffffffa44,xl_04,xh_03,
                       (color_cell_compressor_params *)
                       CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                       in_stack_fffffffffffffa30);
    if (uVar2 == 0) {
      return 0;
    }
    local_40c = local_18->m_num_pixels * 0x38 >> 4;
    if ((1 < *(uint *)(local_28 + 0x14)) && ((ulong)local_40c < *local_20)) {
      if (*(uint *)(local_28 + 0x14) < 4) {
        local_674 = 1;
      }
      else {
        local_674 = *(int *)(local_28 + 0x14) + -2;
      }
      local_410 = local_674;
      for (local_414 = -local_674; local_414 < 2; local_414 = local_414 + 1) {
        for (local_418 = local_2ec + -1; local_418 <= local_2ec + local_410;
            local_418 = local_418 + 1) {
          if ((local_414 != 0) || (local_418 != local_2ec)) {
            for (local_41c = 0; local_41c < local_18->m_num_pixels; local_41c = local_41c + 1) {
              fVar7 = (float)local_2ec;
              auVar6._4_4_ = fVar4;
              auVar6._0_4_ = fVar7;
              auVar6._8_4_ = uVar8;
              auVar6._12_4_ = uVar9;
              auVar5._4_12_ = auVar6._4_12_;
              auVar5._0_4_ = (fVar7 * ((float)local_2d8[local_41c] - (float)local_414)) /
                             ((float)local_418 - (float)local_414) + 0.5;
              auVar6 = roundss(auVar5,auVar5,9);
              fVar7 = clampf(auVar6._0_4_,0.0,fVar7);
              local_2e8[local_41c] = (char)(int)fVar7;
            }
            vec4F_set_scalar(&local_318,0.0);
            vec4F_set_scalar(&local_328,0.0);
            if (local_18->m_has_alpha == '\0') {
              compute_least_squares_endpoints_rgb
                        ((uint32_t)in_stack_fffffffffffffa54,(uint8_t *)in_stack_fffffffffffffa48,
                         (bc7enc_vec4F *)
                         CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                         (bc7enc_vec4F *)
                         CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                         (bc7enc_vec4F *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28);
            }
            else {
              compute_least_squares_endpoints_rgba
                        ((uint32_t)in_stack_fffffffffffffa64,in_stack_fffffffffffffa58,
                         (bc7enc_vec4F *)
                         CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                         in_stack_fffffffffffffa48,
                         (bc7enc_vec4F *)
                         CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                         (color_quad_u8 *)
                         CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
            }
            bVar10 = vec4F_mul(in_stack_fffffffffffff980,
                               (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
            afStack_424 = bVar10.m_c._8_8_;
            local_42c = bVar10.m_c._0_8_;
            local_318.m_c._0_8_ = local_42c;
            local_318.m_c._8_8_ = afStack_424;
            bVar10 = vec4F_mul(in_stack_fffffffffffff980,
                               (float)((ulong)in_stack_fffffffffffff978 >> 0x20));
            local_43c._0_8_ = bVar10.m_c._0_8_;
            local_43c._8_8_ = bVar10.m_c._8_8_;
            local_328.m_c[0] = local_43c[0];
            local_328.m_c[1] = local_43c[1];
            local_328.m_c[2] = local_43c[2];
            local_328.m_c[3] = local_43c[3];
            local_458[0] = local_318.m_c[0];
            local_458[1] = local_318.m_c[1];
            afStack_450[0] = local_318.m_c[2];
            afStack_450[1] = local_318.m_c[3];
            local_468[0] = local_43c[0];
            local_468[1] = local_43c[1];
            afStack_460[0] = local_43c[2];
            afStack_460[1] = local_43c[3];
            fVar4 = bVar10.m_c[1];
            uVar8 = 0;
            uVar9 = 0;
            xl_05.m_c[2] = (float)in_stack_fffffffffffffa60;
            xl_05.m_c._0_8_ = in_stack_fffffffffffffa58;
            xl_05.m_c[3] = in_stack_fffffffffffffa64;
            xh_04.m_c[2] = (float)in_stack_fffffffffffffa50;
            xh_04.m_c._0_8_ = in_stack_fffffffffffffa48;
            xh_04.m_c[3] = in_stack_fffffffffffffa54;
            local_43c = bVar10.m_c;
            uVar2 = find_optimal_solution
                              (in_stack_fffffffffffffa44,xl_05,xh_04,
                               (color_cell_compressor_params *)
                               CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                               in_stack_fffffffffffffa30);
            if (uVar2 == 0) {
              return 0;
            }
          }
        }
      }
    }
  }
  if (local_18->m_pForce_selectors == (uint8_t *)0x0) {
    if (local_c == 1) {
      memcpy(local_498,local_20,0x30);
      local_49c = (int)((float)local_48._0_4_ * 255.0 + 0.5);
      local_4a0 = (int)((float)local_48._4_4_ * 255.0 + 0.5);
      local_4a4 = (int)((float)local_40._0_4_ * 255.0 + 0.5);
      local_4b0 = pack_mode1_to_one_color
                            ((color_cell_compressor_params *)
                             CONCAT17(in_stack_fffffffffffff9e7,
                                      CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9e4,uVar11))),
                             pResults_00,(uint32_t)((ulong)in_stack_fffffffffffff9d0 >> 0x20),
                             (uint32_t)in_stack_fffffffffffff9d0,
                             (uint32_t)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                             (uint8_t *)
                             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      if (local_4b0 < *local_20) {
        memcpy(local_20,local_498,0x30);
        memcpy((void *)local_20[3],(void *)local_20[4],(ulong)local_18->m_num_pixels);
        *local_20 = local_4b0;
      }
    }
    else if (((local_18->m_astc_endpoint_range == 8) && (local_18->m_num_selector_weights == 8)) &&
            (local_18->m_has_alpha == '\0')) {
      memcpy(local_4e0,local_20,0x30);
      local_4e4 = (int)((float)local_48._0_4_ * 255.0 + 0.5);
      local_4e8 = (int)((float)local_48._4_4_ * 255.0 + 0.5);
      local_4ec = (int)((float)local_40._0_4_ * 255.0 + 0.5);
      local_4f8 = pack_astc_4bit_3bit_to_one_color
                            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                             (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                             (uint32_t)in_stack_fffffffffffff9bc,
                             (uint8_t *)CONCAT44(fVar3,in_stack_fffffffffffff9b0));
      if (local_4f8 < *local_20) {
        memcpy(local_20,local_4e0,0x30);
        memcpy((void *)local_20[3],(void *)local_20[4],(ulong)local_18->m_num_pixels);
        *local_20 = local_4f8;
      }
    }
    else if (((local_18->m_astc_endpoint_range == 7) && (local_18->m_num_selector_weights == 4)) &&
            (local_18->m_has_alpha == '\0')) {
      memcpy(local_528,local_20,0x30);
      local_52c = (int)((float)local_48._0_4_ * 255.0 + 0.5);
      local_530 = (int)((float)local_48._4_4_ * 255.0 + 0.5);
      local_534 = (int)((float)local_40._0_4_ * 255.0 + 0.5);
      local_540 = pack_astc_range7_2bit_to_one_color
                            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                             (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                             (uint32_t)in_stack_fffffffffffff9bc,
                             (uint8_t *)CONCAT44(fVar3,in_stack_fffffffffffff9b0));
      if (local_540 < *local_20) {
        memcpy(local_20,local_528,0x30);
        memcpy((void *)local_20[3],(void *)local_20[4],(ulong)local_18->m_num_pixels);
        *local_20 = local_540;
      }
    }
    else if (((local_18->m_astc_endpoint_range == 8) && (local_18->m_num_selector_weights == 4)) &&
            (local_18->m_has_alpha != '\0')) {
      memcpy(local_570,local_20,0x30);
      uVar2 = pack_astc_4bit_2bit_to_one_color_rgba
                        (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                         (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                         (uint32_t)in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8,
                         (uint8_t *)
                         CONCAT17(in_stack_fffffffffffff9e7,
                                  CONCAT16(uVar12,CONCAT24(in_stack_fffffffffffff9e4,uVar11))));
      if (uVar2 < *local_20) {
        memcpy(local_20,local_570,0x30);
        memcpy((void *)local_20[3],(void *)local_20[4],(ulong)local_18->m_num_pixels);
        *local_20 = uVar2;
      }
    }
    else if (((local_18->m_astc_endpoint_range == 0xd) && (local_18->m_num_selector_weights == 4))
            && (local_18->m_has_alpha == '\0')) {
      memcpy(&stack0xfffffffffffffa48,local_20,0x30);
      uVar2 = pack_astc_range13_2bit_to_one_color
                        (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                         (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                         (uint32_t)in_stack_fffffffffffff9bc,
                         (uint8_t *)CONCAT44(fVar3,in_stack_fffffffffffff9b0));
      if (uVar2 < *local_20) {
        memcpy(local_20,&stack0xfffffffffffffa48,0x30);
        memcpy((void *)local_20[3],(void *)local_20[4],(ulong)local_18->m_num_pixels);
        *local_20 = uVar2;
      }
    }
    else if (((local_18->m_astc_endpoint_range == 0xb) && (local_18->m_num_selector_weights == 0x20)
             ) && (local_18->m_has_alpha == '\0')) {
      memcpy(local_600,local_20,0x30);
      uVar2 = pack_astc_range11_5bit_to_one_color
                        (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
                         (uint32_t)in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0,
                         (uint32_t)in_stack_fffffffffffff9bc,
                         (uint8_t *)CONCAT44(fVar3,in_stack_fffffffffffff9b0));
      if (uVar2 < *local_20) {
        memcpy(local_20,local_600,0x30);
        memcpy((void *)local_20[3],(void *)local_20[4],(ulong)local_18->m_num_pixels);
        *local_20 = uVar2;
      }
    }
  }
  return *local_20;
}

Assistant:

uint64_t color_cell_compression(uint32_t mode, const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, const bc7enc_compress_block_params *pComp_params)
{
	if (!pParams->m_astc_endpoint_range)
	{
		assert((mode == 6) || (!pParams->m_has_alpha));
	}
	assert(pParams->m_num_selector_weights >= 1 && pParams->m_num_selector_weights <= 32);
	assert(pParams->m_pSelector_weights[0] == 0);
	assert(pParams->m_pSelector_weights[pParams->m_num_selector_weights - 1] == 64);

	pResults->m_best_overall_err = UINT64_MAX;

	uint32_t cr, cg, cb, ca;

	// If the partition's colors are all the same, then just pack them as a single color.
	if (!pParams->m_pForce_selectors)
	{
		if (mode == 1)
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_mode1_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_4bit_3bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range7_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			if (is_solid_rgba(pParams, cr, cg, cb, ca))
				return pack_astc_4bit_2bit_to_one_color_rgba(pParams, pResults, cr, cg, cb, ca, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range13_2bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			if (is_solid_rgb(pParams, cr, cg, cb))
				return pack_astc_range11_5bit_to_one_color(pParams, pResults, cr, cg, cb, pResults->m_pSelectors);
		}
	}

	// Compute partition's mean color and principle axis.
	bc7enc_vec4F meanColor, axis;
	vec4F_set_scalar(&meanColor, 0.0f);

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
		meanColor = vec4F_add(&meanColor, &color);
	}
				
	bc7enc_vec4F meanColorScaled = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels));

	meanColor = vec4F_mul(&meanColor, 1.0f / (float)(pParams->m_num_pixels * 255.0f));
	vec4F_saturate_in_place(&meanColor);
	
	if (pParams->m_has_alpha)
	{
		// Use incremental PCA for RGBA PCA, because it's simple.
		vec4F_set_scalar(&axis, 0.0f);
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);
			color = vec4F_sub(&color, &meanColorScaled);
			bc7enc_vec4F a = vec4F_mul(&color, color.m_c[0]);
			bc7enc_vec4F b = vec4F_mul(&color, color.m_c[1]);
			bc7enc_vec4F c = vec4F_mul(&color, color.m_c[2]);
			bc7enc_vec4F d = vec4F_mul(&color, color.m_c[3]);
			bc7enc_vec4F n = i ? axis : color;
			vec4F_normalize_in_place(&n);
			axis.m_c[0] += vec4F_dot(&a, &n);
			axis.m_c[1] += vec4F_dot(&b, &n);
			axis.m_c[2] += vec4F_dot(&c, &n);
			axis.m_c[3] += vec4F_dot(&d, &n);
		}
		vec4F_normalize_in_place(&axis);
	}
	else
	{
		// Use covar technique for RGB PCA, because it doesn't require per-pixel normalization.
		float cov[6] = { 0, 0, 0, 0, 0, 0 };

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			const color_quad_u8 *pV = &pParams->m_pPixels[i];
			float r = pV->m_c[0] - meanColorScaled.m_c[0];
			float g = pV->m_c[1] - meanColorScaled.m_c[1];
			float b = pV->m_c[2] - meanColorScaled.m_c[2];
			cov[0] += r*r; cov[1] += r*g; cov[2] += r*b; cov[3] += g*g; cov[4] += g*b; cov[5] += b*b;
		}

		float xr = .9f, xg = 1.0f, xb = .7f;
		for (uint32_t iter = 0; iter < 3; iter++)
		{
			float r = xr * cov[0] + xg * cov[1] + xb * cov[2];
			float g = xr * cov[1] + xg * cov[3] + xb * cov[4];
			float b = xr * cov[2] + xg * cov[4] + xb * cov[5];

			float m = maximumf(maximumf(fabsf(r), fabsf(g)), fabsf(b));
			if (m > 1e-10f)
			{
				m = 1.0f / m;
				r *= m; g *= m; b *= m;
			}

			xr = r; xg = g; xb = b;
		}

		float len = xr * xr + xg * xg + xb * xb;
		if (len < 1e-10f)
			vec4F_set_scalar(&axis, 0.0f);
		else
		{
			len = 1.0f / sqrtf(len);
			xr *= len; xg *= len; xb *= len;
			vec4F_set(&axis, xr, xg, xb, 0);
		}
	}
				
	if (vec4F_dot(&axis, &axis) < .5f)
	{
		if (pParams->m_perceptual)
			vec4F_set(&axis, .213f, .715f, .072f, pParams->m_has_alpha ? .715f : 0);
		else
			vec4F_set(&axis, 1.0f, 1.0f, 1.0f, pParams->m_has_alpha ? 1.0f : 0);
		vec4F_normalize_in_place(&axis);
	}
			
	bc7enc_vec4F minColor, maxColor;

	float l = 1e+9f, h = -1e+9f;

	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
	{
		bc7enc_vec4F color = vec4F_from_color(&pParams->m_pPixels[i]);

		bc7enc_vec4F q = vec4F_sub(&color, &meanColorScaled);
		float d = vec4F_dot(&q, &axis);

		l = minimumf(l, d);
		h = maximumf(h, d);
	}

	l *= (1.0f / 255.0f);
	h *= (1.0f / 255.0f);

	bc7enc_vec4F b0 = vec4F_mul(&axis, l);
	bc7enc_vec4F b1 = vec4F_mul(&axis, h);
	bc7enc_vec4F c0 = vec4F_add(&meanColor, &b0);
	bc7enc_vec4F c1 = vec4F_add(&meanColor, &b1);
	minColor = vec4F_saturate(&c0);
	maxColor = vec4F_saturate(&c1);
				
	bc7enc_vec4F whiteVec;
	vec4F_set_scalar(&whiteVec, 1.0f);
	if (vec4F_dot(&minColor, &whiteVec) > vec4F_dot(&maxColor, &whiteVec))
	{
#if 1
		std::swap(minColor.m_c[0], maxColor.m_c[0]);
		std::swap(minColor.m_c[1], maxColor.m_c[1]);
		std::swap(minColor.m_c[2], maxColor.m_c[2]);
		std::swap(minColor.m_c[3], maxColor.m_c[3]);
#elif 0
		// Fails to compile correctly with MSVC 2019 (code generation bug)
		std::swap(minColor, maxColor);
#else
		// Fails with MSVC 2019
		bc7enc_vec4F temp = minColor;
		minColor = maxColor;
		maxColor = temp;
#endif
	}

	// First find a solution using the block's PCA.
	if (!find_optimal_solution(mode, minColor, maxColor, pParams, pResults))
		return 0;
	
	for (uint32_t i = 0; i < pComp_params->m_least_squares_passes; i++)
	{
		// Now try to refine the solution using least squares by computing the optimal endpoints from the current selectors.
		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, pResults->m_pSelectors, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;
	}
	
	if ((!pParams->m_pForce_selectors) && (pComp_params->m_uber_level > 0))
	{
		// In uber level 1, try varying the selectors a little, somewhat like cluster fit would. First try incrementing the minimum selectors,
		// then try decrementing the selectrors, then try both.
		uint8_t selectors_temp[16], selectors_temp1[16];
		memcpy(selectors_temp, pResults->m_pSelectors, pParams->m_num_pixels);

		const int max_selector = pParams->m_num_selector_weights - 1;

		uint32_t min_sel = 256;
		uint32_t max_sel = 0;
		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			min_sel = minimumu(min_sel, sel);
			max_sel = maximumu(max_sel, sel);
		}

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			selectors_temp1[i] = (uint8_t)sel;
		}

		bc7enc_vec4F xl, xh;
		vec4F_set_scalar(&xl, 0.0f);
		vec4F_set_scalar(&xh, 0.0f);
		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));
				
		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		{
			uint32_t sel = selectors_temp[i];
			if ((sel == min_sel) && (sel < (pParams->m_num_selector_weights - 1)))
				sel++;
			else if ((sel == max_sel) && (sel > 0))
				sel--;
			selectors_temp1[i] = (uint8_t)sel;
		}

		if (pParams->m_has_alpha)
			compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
		else
			compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

		xl = vec4F_mul(&xl, (1.0f / 255.0f));
		xh = vec4F_mul(&xh, (1.0f / 255.0f));

		if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
			return 0;

		// In uber levels 2+, try taking more advantage of endpoint extrapolation by scaling the selectors in one direction or another.
		const uint32_t uber_err_thresh = (pParams->m_num_pixels * 56) >> 4;
		if ((pComp_params->m_uber_level >= 2) && (pResults->m_best_overall_err > uber_err_thresh))
		{
			const int Q = (pComp_params->m_uber_level >= 4) ? (pComp_params->m_uber_level - 2) : 1;
			for (int ly = -Q; ly <= 1; ly++)
			{
				for (int hy = max_selector - 1; hy <= (max_selector + Q); hy++)
				{
					if ((ly == 0) && (hy == max_selector))
						continue;

					for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
						selectors_temp1[i] = (uint8_t)clampf(floorf((float)max_selector * ((float)selectors_temp[i] - (float)ly) / ((float)hy - (float)ly) + .5f), 0, (float)max_selector);

					//bc7enc_vec4F xl, xh;
					vec4F_set_scalar(&xl, 0.0f);
					vec4F_set_scalar(&xh, 0.0f);
					if (pParams->m_has_alpha)
						compute_least_squares_endpoints_rgba(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);
					else
						compute_least_squares_endpoints_rgb(pParams->m_num_pixels, selectors_temp1, pParams->m_pSelector_weightsx, &xl, &xh, pParams->m_pPixels);

					xl = vec4F_mul(&xl, (1.0f / 255.0f));
					xh = vec4F_mul(&xh, (1.0f / 255.0f));

					if (!find_optimal_solution(mode, xl, xh, pParams, pResults))
						return 0;
				}
			}
		}
	}
	
	if (!pParams->m_pForce_selectors)
	{
		// Try encoding the partition as a single color by using the optimal single colors tables to encode the block to its mean.
		if (mode == 1)
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_mode1_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 8) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_3bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 7) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range7_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 8) && (pParams->m_num_selector_weights == 4) && (pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f), a = (int)(.5f + meanColor.m_c[3] * 255.0f);
			uint64_t avg_err = pack_astc_4bit_2bit_to_one_color_rgba(pParams, &avg_results, r, g, b, a, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 13) && (pParams->m_num_selector_weights == 4) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range13_2bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
		else if ((pParams->m_astc_endpoint_range == 11) && (pParams->m_num_selector_weights == 32) && (!pParams->m_has_alpha))
		{
			color_cell_compressor_results avg_results = *pResults;
			const uint32_t r = (int)(.5f + meanColor.m_c[0] * 255.0f), g = (int)(.5f + meanColor.m_c[1] * 255.0f), b = (int)(.5f + meanColor.m_c[2] * 255.0f);
			uint64_t avg_err = pack_astc_range11_5bit_to_one_color(pParams, &avg_results, r, g, b, pResults->m_pSelectors_temp);
			if (avg_err < pResults->m_best_overall_err)
			{
				*pResults = avg_results;
				memcpy(pResults->m_pSelectors, pResults->m_pSelectors_temp, sizeof(pResults->m_pSelectors[0]) * pParams->m_num_pixels);
				pResults->m_best_overall_err = avg_err;
			}
		}
	}

#if BC7ENC_CHECK_OVERALL_ERROR
	check_best_overall_error(pParams, pResults);
#endif
		
	return pResults->m_best_overall_err;
}